

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_sha256sum(uchar *tmp,size_t tmplen,uchar *sha256sum,size_t unused)

{
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  uint local_34;
  EVP_MD_CTX *pEStack_30;
  uint len;
  EVP_MD_CTX *mdctx;
  size_t unused_local;
  uchar *sha256sum_local;
  size_t tmplen_local;
  uchar *tmp_local;
  
  local_34 = 0;
  mdctx = (EVP_MD_CTX *)unused;
  unused_local = (size_t)sha256sum;
  sha256sum_local = (uchar *)tmplen;
  tmplen_local = (size_t)tmp;
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  pEStack_30 = ctx;
  type = EVP_sha256();
  EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
  EVP_DigestUpdate(pEStack_30,(void *)tmplen_local,(size_t)sha256sum_local);
  EVP_DigestFinal_ex(pEStack_30,(uchar *)unused_local,&local_34);
  EVP_MD_CTX_free(pEStack_30);
  return CURLE_OK;
}

Assistant:

static CURLcode Curl_ossl_sha256sum(const unsigned char *tmp, /* input */
                                size_t tmplen,
                                unsigned char *sha256sum /* output */,
                                size_t unused)
{
  EVP_MD_CTX *mdctx;
  unsigned int len = 0;
  (void) unused;

  mdctx =  EVP_MD_CTX_create();
  EVP_DigestInit_ex(mdctx, EVP_sha256(), NULL);
  EVP_DigestUpdate(mdctx, tmp, tmplen);
  EVP_DigestFinal_ex(mdctx, sha256sum, &len);
  EVP_MD_CTX_destroy(mdctx);
  return CURLE_OK;
}